

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O1

int rnd_defensive_item(monst *mtmp)

{
  permonst *ptr;
  boolean bVar1;
  int iVar2;
  uint uVar3;
  
  ptr = mtmp->data;
  iVar2 = monsndx(ptr);
  if ((ptr->mflags1 & 0x40000) == 0) {
    iVar2 = monstr[iVar2];
    bVar1 = attacktype(ptr,0xd);
    if ((((bVar1 == '\0') && ((mtmp->data->mflags1 & 0x10000) == 0)) && (ptr->mlet != '%')) &&
       (ptr->mlet != '6')) {
      uVar3 = mt_random();
      iVar2 = (*(code *)(&DAT_002b8138 +
                        *(int *)(&DAT_002b8138 +
                                ((ulong)uVar3 %
                                (ulong)((uint)(8 < iVar2) + (uint)(6 < iVar2) + (uint)(3 < iVar2) +
                                       8)) * 4)))();
      return iVar2;
    }
  }
  return 0;
}

Assistant:

int rnd_defensive_item(struct monst *mtmp)
{
	const struct permonst *pm = mtmp->data;
	int difficulty = monstr[monsndx(pm)];
	int trycnt = 0;

	if (is_animal(pm) || attacktype(pm, AT_EXPL) || mindless(mtmp->data)
			|| pm->mlet == S_GHOST || pm->mlet == S_KOP)
	    return 0;
try_again:
	switch (rn2(8 + (difficulty > 3) + (difficulty > 6) +
				(difficulty > 8))) {
		case 6: case 9:
			if (mtmp->dlevel->flags.noteleport && ++trycnt < 2)
			    goto try_again;
			if (!rn2(3)) return WAN_TELEPORTATION;
			/* else FALLTHRU */
		case 0: case 1:
			return SCR_TELEPORTATION;
		case 8: case 10:
			if (!rn2(3)) return WAN_CREATE_MONSTER;
			/* else FALLTHRU */
		case 2: return SCR_CREATE_MONSTER;
		case 3: return POT_HEALING;
		case 4: return POT_EXTRA_HEALING;
		case 5: return (mtmp->data != &mons[PM_PESTILENCE]) ?
				POT_FULL_HEALING : POT_SICKNESS;
		case 7: if (is_floater(pm) || mtmp->isshk || mtmp->isgd
						|| mtmp->ispriest
									)
				return 0;
			else
				return WAN_DIGGING;
	}
	/*NOTREACHED*/
	return 0;
}